

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sexp.c
# Opt level: O0

sexp sexp_make_exception(sexp ctx,sexp kind,sexp message,sexp irritants,sexp procedure,sexp source)

{
  sexp psVar1;
  sexp in_RCX;
  sexp in_RDX;
  double in_RSI;
  size_t in_R8;
  sexp_uint_t in_R9;
  sexp exn;
  
  psVar1 = sexp_alloc_tagged_aux(in_RCX,in_R8,in_R9);
  (psVar1->value).flonum = in_RSI;
  (psVar1->value).type.cpl = in_RDX;
  (psVar1->value).type.slots = in_RCX;
  (psVar1->value).bytecode.length = in_R8;
  (psVar1->value).bytecode.max_depth = in_R9;
  (psVar1->value).type.id = (sexp)0x3e;
  return psVar1;
}

Assistant:

sexp sexp_make_exception (sexp ctx, sexp kind, sexp message, sexp irritants,
                          sexp procedure, sexp source) {
  sexp exn = sexp_alloc_type(ctx, exception, SEXP_EXCEPTION);
  sexp_exception_kind(exn) = kind;
  sexp_exception_message(exn) = message;
  sexp_exception_irritants(exn) = irritants;
  sexp_exception_procedure(exn) = procedure;
  sexp_exception_source(exn) = source;
  sexp_exception_stack_trace(exn) = SEXP_FALSE;
  return exn;
}